

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<float> * __thiscall
cimg_library::CImg<float>::draw_image
          (CImg<float> *this,int x0,int y0,int z0,int c0,CImg<float> *sprite,float opacity)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int y;
  int iVar9;
  int iVar10;
  CImg<float> *pCVar11;
  long lVar12;
  ulong uVar13;
  float *pfVar14;
  long lVar15;
  int y_1;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  float *pfVar23;
  int iVar24;
  ulong uVar25;
  int iVar26;
  ulong uVar27;
  float *pfVar28;
  int iVar29;
  float *pfVar30;
  int local_e0;
  CImg<float> local_50;
  
  pfVar28 = this->_data;
  if (pfVar28 != (float *)0x0) {
    uVar21 = this->_width;
    uVar25 = (ulong)uVar21;
    if (uVar21 != 0) {
      uVar2 = this->_height;
      if (uVar2 != 0) {
        uVar3 = this->_depth;
        if (((uVar3 != 0) && (this->_spectrum != 0)) &&
           (pfVar30 = sprite->_data, pfVar30 != (float *)0x0)) {
          lVar15 = uVar2 * uVar25;
          uVar4 = this->_spectrum;
          uVar5 = sprite->_width;
          uVar16 = (ulong)uVar5;
          uVar6 = sprite->_height;
          uVar7 = sprite->_depth;
          uVar8 = sprite->_spectrum;
          if ((pfVar30 < pfVar28 + (ulong)uVar3 * (ulong)uVar4 * lVar15) &&
             (pfVar28 < pfVar30 + (ulong)uVar7 * (ulong)uVar8 * uVar6 * uVar16)) {
            CImg(&local_50,sprite,false);
            this = draw_image(this,x0,y0,z0,c0,&local_50,opacity);
            if ((local_50._is_shared == false) && (local_50._data != (float *)0x0)) {
              operator_delete__(local_50._data);
            }
          }
          else {
            if ((((((y0 == 0 && x0 == 0) && z0 == 0) && c0 == 0) &&
                 ((1.0 <= opacity && (uVar21 == uVar5)))) && (uVar2 == uVar6)) &&
               (((uVar3 == uVar7 && (uVar4 == uVar8)) && (this->_is_shared == false)))) {
              pCVar11 = assign<float>(this,sprite,false);
              return pCVar11;
            }
            iVar26 = uVar21 - (uVar5 + x0);
            if ((int)(uVar5 + x0) <= (int)uVar21) {
              iVar26 = 0;
            }
            uVar21 = x0 >> 0x1f & x0;
            iVar29 = iVar26 + uVar5 + uVar21;
            iVar26 = uVar2 - (uVar6 + y0);
            if ((int)(uVar6 + y0) <= (int)uVar2) {
              iVar26 = 0;
            }
            iVar24 = uVar3 - (uVar7 + z0);
            if ((int)(uVar7 + z0) <= (int)uVar3) {
              iVar24 = 0;
            }
            iVar20 = uVar4 - (uVar8 + c0);
            if ((int)(uVar8 + c0) <= (int)uVar4) {
              iVar20 = 0;
            }
            if (0 < iVar29) {
              iVar26 = (y0 >> 0x1f & y0) + uVar6 + iVar26;
              if (0 < iVar26) {
                iVar24 = (z0 >> 0x1f & z0) + uVar7 + iVar24;
                if (0 < iVar24) {
                  iVar20 = uVar8 + (c0 >> 0x1f & c0) + iVar20;
                  if (0 < iVar20) {
                    lVar12 = (long)iVar29;
                    pfVar30 = pfVar30 + (((-(long)(int)(z0 >> 0x1f & uVar6 * uVar5 * z0) -
                                          (long)(int)(c0 >> 0x1f & uVar7 * c0 * uVar6 * uVar5)) -
                                         (long)(int)(y0 >> 0x1f & uVar5 * y0)) - (long)(int)uVar21);
                    uVar19 = 0;
                    uVar13 = (ulong)(uint)x0;
                    if (x0 < 1) {
                      uVar13 = uVar19;
                    }
                    uVar27 = (ulong)(uint)y0;
                    if (y0 < 1) {
                      uVar27 = uVar19;
                    }
                    uVar22 = (ulong)(uint)z0;
                    if (z0 < 1) {
                      uVar22 = uVar19;
                    }
                    local_e0 = 0;
                    uVar17 = (ulong)(uint)c0;
                    if (c0 < 1) {
                      uVar17 = uVar19;
                    }
                    pfVar28 = pfVar28 + uVar13 + uVar27 * uVar25 +
                                                 uVar22 * lVar15 + (ulong)uVar3 * lVar15 * uVar17;
                    do {
                      iVar10 = 0;
                      do {
                        if (1.0 <= opacity) {
                          iVar9 = 0;
                          do {
                            memcpy(pfVar28,pfVar30,lVar12 * 4);
                            pfVar28 = pfVar28 + this->_width;
                            pfVar30 = pfVar30 + sprite->_width;
                            iVar9 = iVar9 + 1;
                          } while (iVar9 < iVar26);
                        }
                        else {
                          iVar9 = 0;
                          do {
                            pfVar23 = pfVar30;
                            pfVar14 = pfVar28;
                            iVar18 = 0;
                            do {
                              fVar1 = *pfVar23;
                              pfVar23 = pfVar23 + 1;
                              *pfVar14 = fVar1 * ABS(opacity) +
                                         *pfVar14 *
                                         (1.0 - (float)(-(uint)(0.0 <= opacity) & (uint)opacity));
                              pfVar14 = pfVar14 + 1;
                              iVar18 = iVar18 + 1;
                            } while (iVar18 < iVar29);
                            iVar9 = iVar9 + 1;
                            pfVar28 = pfVar14 + (uVar25 - lVar12);
                            pfVar30 = pfVar23 + (uVar16 - lVar12);
                          } while (iVar9 < iVar26);
                          pfVar28 = pfVar14 + (uVar25 - lVar12);
                          pfVar30 = pfVar23 + (uVar16 - lVar12);
                        }
                        pfVar28 = pfVar28 + (uVar2 - iVar26) * uVar25;
                        pfVar30 = pfVar30 + (uVar6 - iVar26) * uVar16;
                        iVar10 = iVar10 + 1;
                      } while (iVar10 < iVar24);
                      pfVar28 = pfVar28 + (ulong)(uVar3 - iVar24) * lVar15;
                      pfVar30 = pfVar30 + uVar6 * uVar16 * (ulong)(uVar7 - iVar24);
                      local_e0 = local_e0 + 1;
                    } while (local_e0 < iVar20);
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return this;
}

Assistant:

CImg<T>& draw_image(const int x0, const int y0, const int z0, const int c0,
                        const CImg<T>& sprite, const float opacity=1) {
      if (is_empty() || !sprite) return *this;
      if (is_overlapped(sprite)) return draw_image(x0,y0,z0,c0,+sprite,opacity);
      if (x0==0 && y0==0 && z0==0 && c0==0 && is_sameXYZC(sprite) && opacity>=1 && !is_shared()) return assign(sprite,false);
      const bool bx = (x0<0), by = (y0<0), bz = (z0<0), bc = (c0<0);
      const int
        lX = sprite.width() - (x0 + sprite.width()>width()?x0 + sprite.width() - width():0) + (bx?x0:0),
        lY = sprite.height() - (y0 + sprite.height()>height()?y0 + sprite.height() - height():0) + (by?y0:0),
        lZ = sprite.depth() - (z0 + sprite.depth()>depth()?z0 + sprite.depth() - depth():0) + (bz?z0:0),
        lC = sprite.spectrum() - (c0 + sprite.spectrum()>spectrum()?c0 + sprite.spectrum() - spectrum():0) + (bc?c0:0);
      const T
        *ptrs = sprite._data -
        (bx?x0:0) -
        (by?y0*sprite.width():0) -
        (bz?z0*sprite.width()*sprite.height():0) -
        (bc?c0*sprite.width()*sprite.height()*sprite.depth():0);
      const unsigned long
        offX = (unsigned long)_width - lX,
        soffX = (unsigned long)sprite._width - lX,
        offY = (unsigned long)_width*(_height - lY),
        soffY = (unsigned long)sprite._width*(sprite._height - lY),
        offZ = (unsigned long)_width*_height*(_depth - lZ),
        soffZ = (unsigned long)sprite._width*sprite._height*(sprite._depth - lZ),
        slX = lX*sizeof(T);
      const float nopacity = cimg::abs(opacity), copacity = 1 - cimg::max(opacity,0);
      if (lX>0 && lY>0 && lZ>0 && lC>0) {
        T *ptrd = data(x0<0?0:x0,y0<0?0:y0,z0<0?0:z0,c0<0?0:c0);
        for (int v = 0; v<lC; ++v) {
          for (int z = 0; z<lZ; ++z) {
            if (opacity>=1) for (int y = 0; y<lY; ++y) { std::memcpy(ptrd,ptrs,slX); ptrd+=_width; ptrs+=sprite._width; }
            else for (int y = 0; y<lY; ++y) {
                for (int x = 0; x<lX; ++x) { *ptrd = (T)(nopacity*(*(ptrs++)) + *ptrd*copacity); ++ptrd; }
                ptrd+=offX; ptrs+=soffX;
              }
            ptrd+=offY; ptrs+=soffY;
          }
          ptrd+=offZ; ptrs+=soffZ;
        }
      }
      return *this;
    }